

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Aig_Obj_t * Saig_BmcObjFrame(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i)

{
  Aig_Man_t *p_00;
  int iVar1;
  int i_00;
  Vec_Int_t *p_01;
  Aig_Obj_t *p_02;
  int iObjLit;
  Vec_Int_t *vFrame;
  Aig_Obj_t *pRes;
  int i_local;
  Aig_Obj_t *pObj_local;
  Saig_Bmc_t *p_local;
  
  p_01 = (Vec_Int_t *)Vec_PtrEntry(p->vAig2Frm,i);
  iVar1 = Aig_ObjId(pObj);
  iVar1 = Vec_IntEntry(p_01,iVar1);
  if (iVar1 == -1) {
    p_local = (Saig_Bmc_t *)0x0;
  }
  else {
    p_00 = p->pFrm;
    i_00 = Abc_Lit2Var(iVar1);
    p_02 = Aig_ManObj(p_00,i_00);
    if (p_02 == (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjId(pObj);
      Vec_IntWriteEntry(p_01,iVar1,-1);
      vFrame = (Vec_Int_t *)0x0;
    }
    else {
      iVar1 = Abc_LitIsCompl(iVar1);
      vFrame = (Vec_Int_t *)Aig_NotCond(p_02,iVar1);
    }
    p_local = (Saig_Bmc_t *)vFrame;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

static inline Aig_Obj_t * Saig_BmcObjFrame( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i )                       
{ 
//    return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     
    Aig_Obj_t * pRes;
    Vec_Int_t * vFrame = (Vec_Int_t *)Vec_PtrEntry( p->vAig2Frm, i );
    int iObjLit = Vec_IntEntry( vFrame, Aig_ObjId(pObj) );
    if ( iObjLit == -1 )
        return NULL;
    pRes = Aig_ManObj( p->pFrm, Abc_Lit2Var(iObjLit) );
    if ( pRes == NULL )
        Vec_IntWriteEntry( vFrame, Aig_ObjId(pObj), -1 );
    else
        pRes = Aig_NotCond( pRes, Abc_LitIsCompl(iObjLit) );
    return pRes;
}